

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O0

void stbir__vertical_gather_with_3_coeffs_cont
               (float *outputp,float *vertical_coefficients,float **inputs,float *input0_end)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float *in_RCX;
  undefined8 *in_RDX;
  float *in_RSI;
  float *in_RDI;
  __m128 o2;
  __m128 o1;
  __m128 o0;
  __m128 c2;
  __m128 c1;
  __m128 c0;
  float c2s;
  float *input2;
  float c1s;
  float *input1;
  float c0s;
  float *input0;
  float *output;
  undefined8 local_688;
  undefined8 uStack_680;
  undefined8 local_638;
  undefined8 uStack_630;
  undefined8 local_628;
  undefined8 uStack_620;
  undefined8 local_618;
  undefined8 uStack_610;
  undefined8 local_608;
  undefined8 uStack_600;
  float *local_5b8;
  float *local_5a8;
  float *local_598;
  float *local_590;
  float local_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float local_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float local_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float local_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float local_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float local_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float local_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float local_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float local_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float local_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float local_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float local_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_78;
  float o0_2;
  __m128 r0_1;
  __m128 o0_1;
  __m128 r3;
  __m128 r2;
  __m128 r1;
  __m128 r0;
  __m128 o3;
  
  fVar1 = *in_RSI;
  local_5a8 = (float *)in_RDX[1];
  fVar2 = in_RSI[1];
  local_5b8 = (float *)in_RDX[2];
  fVar3 = in_RSI[2];
  local_590 = in_RDI;
  for (local_598 = (float *)*in_RDX; 0x3f < (long)in_RCX - (long)local_598;
      local_598 = local_598 + 0x10) {
    local_258 = (float)*(undefined8 *)local_598;
    fStack_254 = (float)((ulong)*(undefined8 *)local_598 >> 0x20);
    fStack_250 = (float)*(undefined8 *)(local_598 + 2);
    fStack_24c = (float)((ulong)*(undefined8 *)(local_598 + 2) >> 0x20);
    fStack_78 = (float)*(undefined8 *)local_590;
    o0_2 = (float)((ulong)*(undefined8 *)local_590 >> 0x20);
    r0_1[0] = (float)*(undefined8 *)(local_590 + 2);
    r0_1[1] = (float)((ulong)*(undefined8 *)(local_590 + 2) >> 0x20);
    local_278 = (float)*(undefined8 *)(local_598 + 4);
    fStack_274 = (float)((ulong)*(undefined8 *)(local_598 + 4) >> 0x20);
    fStack_270 = (float)*(undefined8 *)(local_598 + 6);
    fStack_26c = (float)((ulong)*(undefined8 *)(local_598 + 6) >> 0x20);
    local_98 = (float)*(undefined8 *)(local_590 + 4);
    fStack_94 = (float)((ulong)*(undefined8 *)(local_590 + 4) >> 0x20);
    fStack_90 = (float)*(undefined8 *)(local_590 + 6);
    fStack_8c = (float)((ulong)*(undefined8 *)(local_590 + 6) >> 0x20);
    local_298 = (float)*(undefined8 *)(local_598 + 8);
    fStack_294 = (float)((ulong)*(undefined8 *)(local_598 + 8) >> 0x20);
    fStack_290 = (float)*(undefined8 *)(local_598 + 10);
    fStack_28c = (float)((ulong)*(undefined8 *)(local_598 + 10) >> 0x20);
    local_b8 = (float)*(undefined8 *)(local_590 + 8);
    fStack_b4 = (float)((ulong)*(undefined8 *)(local_590 + 8) >> 0x20);
    fStack_b0 = (float)*(undefined8 *)(local_590 + 10);
    fStack_ac = (float)((ulong)*(undefined8 *)(local_590 + 10) >> 0x20);
    local_2b8 = (float)*(undefined8 *)(local_598 + 0xc);
    fStack_2b4 = (float)((ulong)*(undefined8 *)(local_598 + 0xc) >> 0x20);
    fStack_2b0 = (float)*(undefined8 *)(local_598 + 0xe);
    fStack_2ac = (float)((ulong)*(undefined8 *)(local_598 + 0xe) >> 0x20);
    local_d8 = (float)*(undefined8 *)(local_590 + 0xc);
    fStack_d4 = (float)((ulong)*(undefined8 *)(local_590 + 0xc) >> 0x20);
    fStack_d0 = (float)*(undefined8 *)(local_590 + 0xe);
    fStack_cc = (float)((ulong)*(undefined8 *)(local_590 + 0xe) >> 0x20);
    local_2d8 = (float)*(undefined8 *)local_5a8;
    fStack_2d4 = (float)((ulong)*(undefined8 *)local_5a8 >> 0x20);
    fStack_2d0 = (float)*(undefined8 *)(local_5a8 + 2);
    fStack_2cc = (float)((ulong)*(undefined8 *)(local_5a8 + 2) >> 0x20);
    local_2f8 = (float)*(undefined8 *)(local_5a8 + 4);
    fStack_2f4 = (float)((ulong)*(undefined8 *)(local_5a8 + 4) >> 0x20);
    fStack_2f0 = (float)*(undefined8 *)(local_5a8 + 6);
    fStack_2ec = (float)((ulong)*(undefined8 *)(local_5a8 + 6) >> 0x20);
    local_318 = (float)*(undefined8 *)(local_5a8 + 8);
    fStack_314 = (float)((ulong)*(undefined8 *)(local_5a8 + 8) >> 0x20);
    fStack_310 = (float)*(undefined8 *)(local_5a8 + 10);
    fStack_30c = (float)((ulong)*(undefined8 *)(local_5a8 + 10) >> 0x20);
    local_338 = (float)*(undefined8 *)(local_5a8 + 0xc);
    fStack_334 = (float)((ulong)*(undefined8 *)(local_5a8 + 0xc) >> 0x20);
    fStack_330 = (float)*(undefined8 *)(local_5a8 + 0xe);
    fStack_32c = (float)((ulong)*(undefined8 *)(local_5a8 + 0xe) >> 0x20);
    local_358 = (float)*(undefined8 *)local_5b8;
    fStack_354 = (float)((ulong)*(undefined8 *)local_5b8 >> 0x20);
    fStack_350 = (float)*(undefined8 *)(local_5b8 + 2);
    fStack_34c = (float)((ulong)*(undefined8 *)(local_5b8 + 2) >> 0x20);
    local_608 = CONCAT44(o0_2 + fStack_254 * fVar1 + fStack_2d4 * fVar2 + fStack_354 * fVar3,
                         fStack_78 + local_258 * fVar1 + local_2d8 * fVar2 + local_358 * fVar3);
    uStack_600 = CONCAT44(r0_1[1] + fStack_24c * fVar1 + fStack_2cc * fVar2 + fStack_34c * fVar3,
                          r0_1[0] + fStack_250 * fVar1 + fStack_2d0 * fVar2 + fStack_350 * fVar3);
    local_378 = (float)*(undefined8 *)(local_5b8 + 4);
    fStack_374 = (float)((ulong)*(undefined8 *)(local_5b8 + 4) >> 0x20);
    fStack_370 = (float)*(undefined8 *)(local_5b8 + 6);
    fStack_36c = (float)((ulong)*(undefined8 *)(local_5b8 + 6) >> 0x20);
    local_618 = CONCAT44(fStack_94 + fStack_274 * fVar1 + fStack_2f4 * fVar2 + fStack_374 * fVar3,
                         local_98 + local_278 * fVar1 + local_2f8 * fVar2 + local_378 * fVar3);
    uStack_610 = CONCAT44(fStack_8c + fStack_26c * fVar1 + fStack_2ec * fVar2 + fStack_36c * fVar3,
                          fStack_90 + fStack_270 * fVar1 + fStack_2f0 * fVar2 + fStack_370 * fVar3);
    local_398 = (float)*(undefined8 *)(local_5b8 + 8);
    fStack_394 = (float)((ulong)*(undefined8 *)(local_5b8 + 8) >> 0x20);
    fStack_390 = (float)*(undefined8 *)(local_5b8 + 10);
    fStack_38c = (float)((ulong)*(undefined8 *)(local_5b8 + 10) >> 0x20);
    local_628 = CONCAT44(fStack_b4 + fStack_294 * fVar1 + fStack_314 * fVar2 + fStack_394 * fVar3,
                         local_b8 + local_298 * fVar1 + local_318 * fVar2 + local_398 * fVar3);
    uStack_620 = CONCAT44(fStack_ac + fStack_28c * fVar1 + fStack_30c * fVar2 + fStack_38c * fVar3,
                          fStack_b0 + fStack_290 * fVar1 + fStack_310 * fVar2 + fStack_390 * fVar3);
    local_3b8 = (float)*(undefined8 *)(local_5b8 + 0xc);
    fStack_3b4 = (float)((ulong)*(undefined8 *)(local_5b8 + 0xc) >> 0x20);
    fStack_3b0 = (float)*(undefined8 *)(local_5b8 + 0xe);
    fStack_3ac = (float)((ulong)*(undefined8 *)(local_5b8 + 0xe) >> 0x20);
    local_638 = CONCAT44(fStack_d4 + fStack_2b4 * fVar1 + fStack_334 * fVar2 + fStack_3b4 * fVar3,
                         local_d8 + local_2b8 * fVar1 + local_338 * fVar2 + local_3b8 * fVar3);
    uStack_630 = CONCAT44(fStack_cc + fStack_2ac * fVar1 + fStack_32c * fVar2 + fStack_3ac * fVar3,
                          fStack_d0 + fStack_2b0 * fVar1 + fStack_330 * fVar2 + fStack_3b0 * fVar3);
    *(undefined8 *)local_590 = local_608;
    *(undefined8 *)(local_590 + 2) = uStack_600;
    *(undefined8 *)(local_590 + 4) = local_618;
    *(undefined8 *)(local_590 + 6) = uStack_610;
    *(undefined8 *)(local_590 + 8) = local_628;
    *(undefined8 *)(local_590 + 10) = uStack_620;
    *(undefined8 *)(local_590 + 0xc) = local_638;
    *(undefined8 *)(local_590 + 0xe) = uStack_630;
    local_590 = local_590 + 0x10;
    local_5a8 = local_5a8 + 0x10;
    local_5b8 = local_5b8 + 0x10;
  }
  for (; 0xf < (long)in_RCX - (long)local_598; local_598 = local_598 + 4) {
    local_3d8 = (float)*(undefined8 *)local_598;
    fStack_3d4 = (float)((ulong)*(undefined8 *)local_598 >> 0x20);
    fStack_3d0 = (float)*(undefined8 *)(local_598 + 2);
    fStack_3cc = (float)((ulong)*(undefined8 *)(local_598 + 2) >> 0x20);
    local_1f8 = (float)*(undefined8 *)local_590;
    fStack_1f4 = (float)((ulong)*(undefined8 *)local_590 >> 0x20);
    fStack_1f0 = (float)*(undefined8 *)(local_590 + 2);
    fStack_1ec = (float)((ulong)*(undefined8 *)(local_590 + 2) >> 0x20);
    local_3f8 = (float)*(undefined8 *)local_5a8;
    fStack_3f4 = (float)((ulong)*(undefined8 *)local_5a8 >> 0x20);
    fStack_3f0 = (float)*(undefined8 *)(local_5a8 + 2);
    fStack_3ec = (float)((ulong)*(undefined8 *)(local_5a8 + 2) >> 0x20);
    local_418 = (float)*(undefined8 *)local_5b8;
    fStack_414 = (float)((ulong)*(undefined8 *)local_5b8 >> 0x20);
    fStack_410 = (float)*(undefined8 *)(local_5b8 + 2);
    fStack_40c = (float)((ulong)*(undefined8 *)(local_5b8 + 2) >> 0x20);
    local_688 = CONCAT44(fStack_1f4 + fStack_3d4 * fVar1 + fStack_3f4 * fVar2 + fStack_414 * fVar3,
                         local_1f8 + local_3d8 * fVar1 + local_3f8 * fVar2 + local_418 * fVar3);
    uStack_680 = CONCAT44(fStack_1ec + fStack_3cc * fVar1 + fStack_3ec * fVar2 + fStack_40c * fVar3,
                          fStack_1f0 + fStack_3d0 * fVar1 + fStack_3f0 * fVar2 + fStack_410 * fVar3)
    ;
    *(undefined8 *)local_590 = local_688;
    *(undefined8 *)(local_590 + 2) = uStack_680;
    local_590 = local_590 + 4;
    local_5a8 = local_5a8 + 4;
    local_5b8 = local_5b8 + 4;
  }
  for (; local_598 < in_RCX; local_598 = local_598 + 1) {
    *local_590 = *local_5b8 * fVar3 + *local_5a8 * fVar2 + *local_590 + *local_598 * fVar1;
    local_590 = local_590 + 1;
    local_5a8 = local_5a8 + 1;
    local_5b8 = local_5b8 + 1;
  }
  return;
}

Assistant:

static void STBIR_chans( stbir__vertical_gather_with_,_coeffs)( float * outputp, float const * vertical_coefficients, float const ** inputs, float const * input0_end )
{
  float STBIR_SIMD_STREAMOUT_PTR( * ) output = outputp;

  stbIF0( float const * input0 = inputs[0]; float c0s = vertical_coefficients[0]; )
  stbIF1( float const * input1 = inputs[1]; float c1s = vertical_coefficients[1]; )
  stbIF2( float const * input2 = inputs[2]; float c2s = vertical_coefficients[2]; )
  stbIF3( float const * input3 = inputs[3]; float c3s = vertical_coefficients[3]; )
  stbIF4( float const * input4 = inputs[4]; float c4s = vertical_coefficients[4]; )
  stbIF5( float const * input5 = inputs[5]; float c5s = vertical_coefficients[5]; )
  stbIF6( float const * input6 = inputs[6]; float c6s = vertical_coefficients[6]; )
  stbIF7( float const * input7 = inputs[7]; float c7s = vertical_coefficients[7]; )

#if ( STBIR__vertical_channels == 1 ) && !defined(STB_IMAGE_RESIZE_VERTICAL_CONTINUE)
  // check single channel one weight
  if ( ( c0s >= (1.0f-0.000001f) ) && ( c0s <= (1.0f+0.000001f) ) )
  {
    STBIR_MEMCPY( output, input0, (char*)input0_end - (char*)input0 );
    return;
  }
#endif

  #ifdef STBIR_SIMD
  {
    stbIF0(stbir__simdfX c0 = stbir__simdf_frepX( c0s ); )
    stbIF1(stbir__simdfX c1 = stbir__simdf_frepX( c1s ); )
    stbIF2(stbir__simdfX c2 = stbir__simdf_frepX( c2s ); )
    stbIF3(stbir__simdfX c3 = stbir__simdf_frepX( c3s ); )
    stbIF4(stbir__simdfX c4 = stbir__simdf_frepX( c4s ); )
    stbIF5(stbir__simdfX c5 = stbir__simdf_frepX( c5s ); )
    stbIF6(stbir__simdfX c6 = stbir__simdf_frepX( c6s ); )
    stbIF7(stbir__simdfX c7 = stbir__simdf_frepX( c7s ); )

    STBIR_SIMD_NO_UNROLL_LOOP_START
    while ( ( (char*)input0_end - (char*) input0 ) >= (16*stbir__simdfX_float_count) )
    {
      stbir__simdfX o0, o1, o2, o3, r0, r1, r2, r3;
      STBIR_SIMD_NO_UNROLL(output);

      // prefetch four loop iterations ahead (doesn't affect much for small resizes, but helps with big ones)
      stbIF0( stbir__prefetch( input0 + (16*stbir__simdfX_float_count) ); )
      stbIF1( stbir__prefetch( input1 + (16*stbir__simdfX_float_count) ); )
      stbIF2( stbir__prefetch( input2 + (16*stbir__simdfX_float_count) ); )
      stbIF3( stbir__prefetch( input3 + (16*stbir__simdfX_float_count) ); )
      stbIF4( stbir__prefetch( input4 + (16*stbir__simdfX_float_count) ); )
      stbIF5( stbir__prefetch( input5 + (16*stbir__simdfX_float_count) ); )
      stbIF6( stbir__prefetch( input6 + (16*stbir__simdfX_float_count) ); )
      stbIF7( stbir__prefetch( input7 + (16*stbir__simdfX_float_count) ); )

      #ifdef STB_IMAGE_RESIZE_VERTICAL_CONTINUE
      stbIF0( stbir__simdfX_load( o0, output );      stbir__simdfX_load( o1, output+stbir__simdfX_float_count );   stbir__simdfX_load( o2, output+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( o3, output+(3*stbir__simdfX_float_count) );
              stbir__simdfX_load( r0, input0 );      stbir__simdfX_load( r1, input0+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input0+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input0+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c0 );  stbir__simdfX_madd( o1, o1, r1, c0 );                         stbir__simdfX_madd( o2, o2, r2, c0 );                             stbir__simdfX_madd( o3, o3, r3, c0 ); )
      #else
      stbIF0( stbir__simdfX_load( r0, input0 );      stbir__simdfX_load( r1, input0+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input0+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input0+(3*stbir__simdfX_float_count) );
              stbir__simdfX_mult( o0, r0, c0 );      stbir__simdfX_mult( o1, r1, c0 );                             stbir__simdfX_mult( o2, r2, c0 );                                 stbir__simdfX_mult( o3, r3, c0 );  )
      #endif

      stbIF1( stbir__simdfX_load( r0, input1 );      stbir__simdfX_load( r1, input1+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input1+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input1+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c1 );  stbir__simdfX_madd( o1, o1, r1, c1 );                         stbir__simdfX_madd( o2, o2, r2, c1 );                             stbir__simdfX_madd( o3, o3, r3, c1 ); )
      stbIF2( stbir__simdfX_load( r0, input2 );      stbir__simdfX_load( r1, input2+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input2+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input2+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c2 );  stbir__simdfX_madd( o1, o1, r1, c2 );                         stbir__simdfX_madd( o2, o2, r2, c2 );                             stbir__simdfX_madd( o3, o3, r3, c2 ); )
      stbIF3( stbir__simdfX_load( r0, input3 );      stbir__simdfX_load( r1, input3+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input3+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input3+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c3 );  stbir__simdfX_madd( o1, o1, r1, c3 );                         stbir__simdfX_madd( o2, o2, r2, c3 );                             stbir__simdfX_madd( o3, o3, r3, c3 ); )
      stbIF4( stbir__simdfX_load( r0, input4 );      stbir__simdfX_load( r1, input4+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input4+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input4+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c4 );  stbir__simdfX_madd( o1, o1, r1, c4 );                         stbir__simdfX_madd( o2, o2, r2, c4 );                             stbir__simdfX_madd( o3, o3, r3, c4 ); )
      stbIF5( stbir__simdfX_load( r0, input5 );      stbir__simdfX_load( r1, input5+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input5+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input5+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c5 );  stbir__simdfX_madd( o1, o1, r1, c5 );                         stbir__simdfX_madd( o2, o2, r2, c5 );                             stbir__simdfX_madd( o3, o3, r3, c5 ); )
      stbIF6( stbir__simdfX_load( r0, input6 );      stbir__simdfX_load( r1, input6+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input6+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input6+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c6 );  stbir__simdfX_madd( o1, o1, r1, c6 );                         stbir__simdfX_madd( o2, o2, r2, c6 );                             stbir__simdfX_madd( o3, o3, r3, c6 ); )
      stbIF7( stbir__simdfX_load( r0, input7 );      stbir__simdfX_load( r1, input7+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input7+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input7+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c7 );  stbir__simdfX_madd( o1, o1, r1, c7 );                         stbir__simdfX_madd( o2, o2, r2, c7 );                             stbir__simdfX_madd( o3, o3, r3, c7 ); )

      stbir__simdfX_store( output, o0 );             stbir__simdfX_store( output+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output+(2*stbir__simdfX_float_count), o2 );  stbir__simdfX_store( output+(3*stbir__simdfX_float_count), o3 );
      output += (4*stbir__simdfX_float_count);
      stbIF0( input0 += (4*stbir__simdfX_float_count); ) stbIF1( input1 += (4*stbir__simdfX_float_count); ) stbIF2( input2 += (4*stbir__simdfX_float_count); ) stbIF3( input3 += (4*stbir__simdfX_float_count); ) stbIF4( input4 += (4*stbir__simdfX_float_count); ) stbIF5( input5 += (4*stbir__simdfX_float_count); ) stbIF6( input6 += (4*stbir__simdfX_float_count); ) stbIF7( input7 += (4*stbir__simdfX_float_count); )
    }

    STBIR_SIMD_NO_UNROLL_LOOP_START
    while ( ( (char*)input0_end - (char*) input0 ) >= 16 )
    {
      stbir__simdf o0, r0;
      STBIR_SIMD_NO_UNROLL(output);

      #ifdef STB_IMAGE_RESIZE_VERTICAL_CONTINUE
      stbIF0( stbir__simdf_load( o0, output );   stbir__simdf_load( r0, input0 ); stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c0 ) ); )
      #else
      stbIF0( stbir__simdf_load( r0, input0 );  stbir__simdf_mult( o0, r0, stbir__if_simdf8_cast_to_simdf4( c0 ) ); )
      #endif
      stbIF1( stbir__simdf_load( r0, input1 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c1 ) ); )
      stbIF2( stbir__simdf_load( r0, input2 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c2 ) ); )
      stbIF3( stbir__simdf_load( r0, input3 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c3 ) ); )
      stbIF4( stbir__simdf_load( r0, input4 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c4 ) ); )
      stbIF5( stbir__simdf_load( r0, input5 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c5 ) ); )
      stbIF6( stbir__simdf_load( r0, input6 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c6 ) ); )
      stbIF7( stbir__simdf_load( r0, input7 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c7 ) ); )

      stbir__simdf_store( output, o0 );
      output += 4;
      stbIF0( input0 += 4; ) stbIF1( input1 += 4; ) stbIF2( input2 += 4; ) stbIF3( input3 += 4; ) stbIF4( input4 += 4; ) stbIF5( input5 += 4; ) stbIF6( input6 += 4; ) stbIF7( input7 += 4; )
    }
  }
  #else
  STBIR_NO_UNROLL_LOOP_START
  while ( ( (char*)input0_end - (char*) input0 ) >= 16 )
  {
    float o0, o1, o2, o3;
    STBIR_NO_UNROLL(output);
    #ifdef STB_IMAGE_RESIZE_VERTICAL_CONTINUE
    stbIF0( o0 = output[0] + input0[0] * c0s; o1 = output[1] + input0[1] * c0s; o2 = output[2] + input0[2] * c0s; o3 = output[3] + input0[3] * c0s; )
    #else
    stbIF0( o0  = input0[0] * c0s; o1  = input0[1] * c0s; o2  = input0[2] * c0s; o3  = input0[3] * c0s; )
    #endif
    stbIF1( o0 += input1[0] * c1s; o1 += input1[1] * c1s; o2 += input1[2] * c1s; o3 += input1[3] * c1s; )
    stbIF2( o0 += input2[0] * c2s; o1 += input2[1] * c2s; o2 += input2[2] * c2s; o3 += input2[3] * c2s; )
    stbIF3( o0 += input3[0] * c3s; o1 += input3[1] * c3s; o2 += input3[2] * c3s; o3 += input3[3] * c3s; )
    stbIF4( o0 += input4[0] * c4s; o1 += input4[1] * c4s; o2 += input4[2] * c4s; o3 += input4[3] * c4s; )
    stbIF5( o0 += input5[0] * c5s; o1 += input5[1] * c5s; o2 += input5[2] * c5s; o3 += input5[3] * c5s; )
    stbIF6( o0 += input6[0] * c6s; o1 += input6[1] * c6s; o2 += input6[2] * c6s; o3 += input6[3] * c6s; )
    stbIF7( o0 += input7[0] * c7s; o1 += input7[1] * c7s; o2 += input7[2] * c7s; o3 += input7[3] * c7s; )
    output[0] = o0; output[1] = o1; output[2] = o2; output[3] = o3;
    output += 4;
    stbIF0( input0 += 4; ) stbIF1( input1 += 4; ) stbIF2( input2 += 4; ) stbIF3( input3 += 4; ) stbIF4( input4 += 4; ) stbIF5( input5 += 4; ) stbIF6( input6 += 4; ) stbIF7( input7 += 4; )
  }
  #endif
  STBIR_NO_UNROLL_LOOP_START
  while ( input0 < input0_end )
  {
    float o0;
    STBIR_NO_UNROLL(output);
    #ifdef STB_IMAGE_RESIZE_VERTICAL_CONTINUE
    stbIF0( o0 = output[0] + input0[0] * c0s; )
    #else
    stbIF0( o0  = input0[0] * c0s; )
    #endif
    stbIF1( o0 += input1[0] * c1s; )
    stbIF2( o0 += input2[0] * c2s; )
    stbIF3( o0 += input3[0] * c3s; )
    stbIF4( o0 += input4[0] * c4s; )
    stbIF5( o0 += input5[0] * c5s; )
    stbIF6( o0 += input6[0] * c6s; )
    stbIF7( o0 += input7[0] * c7s; )
    output[0] = o0;
    ++output;
    stbIF0( ++input0; ) stbIF1( ++input1; ) stbIF2( ++input2; ) stbIF3( ++input3; ) stbIF4( ++input4; ) stbIF5( ++input5; ) stbIF6( ++input6; ) stbIF7( ++input7; )
  }
}